

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryReader::readGlobals(WasmBinaryReader *this)

{
  uint32_t uVar1;
  ostream *poVar2;
  Type init;
  Expression *pEVar3;
  char *pcVar4;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> this_00;
  __node_base *p_Var5;
  char *pcVar6;
  Name NVar7;
  Name name;
  Name name_00;
  _Alloc_hider in_stack_ffffffffffffff18;
  undefined1 local_c8 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  pair<wasm::Name,_bool> local_70;
  char *local_58;
  long local_50;
  wasm *local_48;
  long local_40;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> global;
  
  uVar1 = getU32LEB(this);
  pcVar4 = (char *)(ulong)uVar1;
  local_50 = (long)(this->wasm->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->wasm->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_c8 = (undefined1  [8])&usedNames._M_h._M_rehash_policy._M_next_resize;
  usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
  usedNames._M_h._M_bucket_count = 0;
  usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
  usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  usedNames._M_h._M_rehash_policy._4_4_ = 0;
  usedNames._M_h._M_rehash_policy._M_next_resize = 0;
  local_48 = (wasm *)&this->globalNames;
  p_Var5 = &(this->globalNames)._M_h._M_before_begin;
  pcVar6 = pcVar4 + local_50;
  local_58 = pcVar4;
  global._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)this;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    if (pcVar6 <= (char *)(ulong)(uint)*(size_type *)(p_Var5 + 1)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "warning: global index out of bounds in name section: ");
      name_00.super_IString.str._M_str = pcVar4;
      name_00.super_IString.str._M_len = (size_t)p_Var5[3]._M_nxt;
      poVar2 = wasm::operator<<((wasm *)poVar2,
                                *(ostream **)
                                 &((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor,name_00
                               );
      poVar2 = std::operator<<(poVar2," at index ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,'\n');
    }
    std::__detail::
    _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)local_c8,(value_type *)(p_Var5 + 2));
  }
  pcVar6 = (char *)0x0;
  this_00._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
       global._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
       super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
  while( true ) {
    if (local_58 == pcVar6) {
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_c8);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffff18,"global$",(allocator<char> *)&local_40);
    NVar7 = makeName((string *)&stack0xffffffffffffff18,(size_t)pcVar6);
    name.super_IString.str._M_str = local_c8;
    name.super_IString.str._M_len = (size_t)NVar7.super_IString.str._M_str;
    getOrMakeName(&local_70,local_48,
                  (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                   *)(pcVar6 + local_50),(Index)NVar7.super_IString.str._M_len,name,
                  (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)in_stack_ffffffffffffff18._M_p);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
    init = getConcreteType((WasmBinaryReader *)
                           this_00._M_t.
                           super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                           .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
    uVar1 = getU32LEB((WasmBinaryReader *)
                      this_00._M_t.
                      super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
    if (1 < uVar1) break;
    pEVar3 = readExpression((WasmBinaryReader *)
                            global._M_t.
                            super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                            .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
    NVar7.super_IString.str._M_str = (char *)local_70.first.super_IString.str._M_len;
    NVar7.super_IString.str._M_len = (size_t)&local_40;
    Builder::makeGlobal(NVar7,(Type)local_70.first.super_IString.str._M_str,(Expression *)init.id,
                        (Mutability)pEVar3);
    this_00 = global;
    *(bool *)(local_40 + 0x10) = local_70.second;
    Module::addGlobal(*(Module **)
                       global._M_t.
                       super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                       super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,
                      (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_40);
    std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
              ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&local_40);
    pcVar6 = pcVar6 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usedNames._M_h._M_single_bucket,"Global mutability must be 0 or 1",
             (allocator<char> *)&local_40);
  throwError((WasmBinaryReader *)
             global._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,
             (string *)&usedNames._M_h._M_single_bucket);
}

Assistant:

void WasmBinaryReader::readGlobals() {
  size_t num = getU32LEB();
  auto numImports = wasm.globals.size();
  std::unordered_set<Name> usedNames;
  for (auto& [index, name] : globalNames) {
    if (index >= num + numImports) {
      std::cerr << "warning: global index out of bounds in name section: "
                << name << " at index " << index << '\n';
    }
    usedNames.insert(name);
  }
  for (size_t i = 0; i < num; i++) {
    auto [name, isExplicit] = getOrMakeName(
      globalNames, numImports + i, makeName("global$", i), usedNames);
    auto type = getConcreteType();
    auto mutable_ = getU32LEB();
    if (mutable_ & ~1) {
      throwError("Global mutability must be 0 or 1");
    }
    auto* init = readExpression();
    auto global = Builder::makeGlobal(
      name, type, init, mutable_ ? Builder::Mutable : Builder::Immutable);
    global->hasExplicitName = isExplicit;
    wasm.addGlobal(std::move(global));
  }
}